

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

Real __thiscall PeleLM::getCellsCount(PeleLM *this)

{
  EBCellFlagFab *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  FabType FVar4;
  EBFArrayBoxFactory *this_01;
  FabArray<amrex::EBCellFlagFab> *pFVar5;
  FabArray<amrex::FArrayBox> *this_02;
  int j_2;
  int iVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  void *__s;
  double *pdVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double *pdVar16;
  int j_1;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  double *pdVar21;
  double dVar22;
  double local_2f0;
  Box local_2e4;
  long local_2c8;
  int local_2bc;
  Array4<double> local_2b8;
  PeleLM *local_278;
  long local_270;
  ulong local_268;
  long local_260;
  long local_258;
  Array4<const_double> vfrac;
  MFIter mfi;
  MultiFab MFTemp;
  
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  local_2b8.p = (double *)&PTR__FabFactory_007d2928;
  local_278 = this;
  amrex::MultiFab::MultiFab
            (&MFTemp,&(this->super_NavierStokesBase).super_AmrLevel.grids,
             &(this->super_NavierStokesBase).super_AmrLevel.dmap,1,0,(MFInfo *)&mfi,
             (FabFactory<amrex::FArrayBox> *)&local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&MFTemp.super_FabArray<amrex::FArrayBox>,1.0);
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)&MFTemp,true);
  while( true ) {
    if (mfi.endIndex <= mfi.currentIndex) {
      amrex::MFIter::~MFIter(&mfi);
      local_2e4.smallend.vect[0] = 0;
      local_2e4.smallend.vect[1] = 0;
      local_2e4.smallend.vect[2] = 0;
      amrex::MFIter::MFIter(&mfi,(FabArrayBase *)&MFTemp,true);
      local_2f0 = 0.0;
      while (mfi.currentIndex < mfi.endIndex) {
        amrex::MFIter::growntilebox((Box *)&vfrac,&mfi,&local_2e4.smallend);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_2b8,&MFTemp.super_FabArray<amrex::FArrayBox>,&mfi)
        ;
        lVar9 = (long)(int)vfrac.jstride;
        pdVar21 = (double *)
                  ((lVar9 - local_2b8.begin.z) * local_2b8.kstride * 8 +
                   ((long)vfrac.p._4_4_ - (long)local_2b8.begin.y) * local_2b8.jstride * 8 +
                   (long)(int)vfrac.p * 8 + (long)local_2b8.begin.x * -8 + (long)local_2b8.p);
        dVar22 = 0.0;
        for (; lVar14 = (long)vfrac.p._4_4_, pdVar16 = pdVar21, lVar9 <= vfrac.kstride._4_4_;
            lVar9 = lVar9 + 1) {
          for (; lVar15 = (long)(int)vfrac.p, pdVar11 = pdVar16, lVar14 <= (int)vfrac.kstride;
              lVar14 = lVar14 + 1) {
            for (; lVar15 <= vfrac.jstride._4_4_; lVar15 = lVar15 + 1) {
              dVar22 = dVar22 + *pdVar11;
              pdVar11 = pdVar11 + 1;
            }
            pdVar16 = pdVar16 + local_2b8.jstride;
          }
          pdVar21 = pdVar21 + local_2b8.kstride;
        }
        local_2f0 = local_2f0 + dVar22;
        amrex::MFIter::operator++(&mfi);
      }
      amrex::MFIter::~MFIter(&mfi);
      amrex::MultiFab::~MultiFab(&MFTemp);
      return local_2f0;
    }
    amrex::MFIter::tilebox(&local_2e4,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_2b8,&MFTemp.super_FabArray<amrex::FArrayBox>,&mfi);
    this_01 = (EBFArrayBoxFactory *)
              __dynamic_cast((local_278->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
                             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                             _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (this_01 == (EBFArrayBoxFactory *)0x0) break;
    pFVar5 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab(this_01);
    piVar7 = &mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar7 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + mfi.currentIndex;
    }
    this_00 = (pFVar5->m_fabs_v).
              super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
              _M_impl.super__Vector_impl_data._M_start[*piVar7];
    FVar4 = amrex::EBCellFlagFab::getType(this_00,&local_2e4);
    iVar3 = local_2e4.bigend.vect[1];
    iVar2 = local_2e4.bigend.vect[0];
    if (FVar4 == covered) {
      local_260 = local_2b8.kstride;
      iVar1 = local_2e4.smallend.vect[0];
      lVar15 = (long)local_2e4.smallend.vect[0];
      local_268 = (ulong)local_2e4.smallend.vect[1];
      local_258 = (long)local_2e4.bigend.vect[2];
      uVar8 = local_2e4.bigend.vect[0] - local_2e4.smallend.vect[0];
      lVar14 = local_2b8.jstride * 8;
      local_270 = (local_268 - (long)local_2b8.begin.y) * lVar14 + (long)local_2b8.begin.x * -8 +
                  (long)local_2b8.p;
      iVar6 = local_2e4.smallend.vect[2] - local_2b8.begin.z;
      lVar9 = (long)local_2e4.smallend.vect[2];
      while (lVar9 <= local_258) {
        __s = (void *)(local_270 + (iVar6 * local_260 + lVar15) * 8);
        local_2c8 = lVar9;
        local_2bc = iVar6;
        for (uVar19 = local_268 & 0xffffffff; (int)uVar19 <= iVar3;
            uVar19 = (ulong)((int)uVar19 + 1)) {
          if (iVar1 <= iVar2) {
            memset(__s,0,(ulong)uVar8 * 8 + 8);
          }
          __s = (void *)((long)__s + lVar14);
        }
        iVar6 = local_2bc + 1;
        lVar9 = local_2c8 + 1;
      }
    }
    else {
      FVar4 = amrex::EBCellFlagFab::getType(this_00,&local_2e4);
      if (FVar4 != regular) {
        this_02 = &amrex::EBFArrayBoxFactory::getVolFrac(this_01)->super_FabArray<amrex::FArrayBox>;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&vfrac,this_02,&mfi);
        local_2c8 = (long)local_2e4.smallend.vect[1];
        lVar14 = (long)local_2e4.smallend.vect[2];
        lVar17 = CONCAT44(vfrac.kstride._4_4_,(int)vfrac.kstride) * 8;
        lVar9 = CONCAT44(vfrac.jstride._4_4_,(int)vfrac.jstride) * 8;
        lVar15 = (local_2c8 - local_2b8.begin.y) * local_2b8.jstride * 8 +
                 (lVar14 - local_2b8.begin.z) * local_2b8.kstride * 8 +
                 (long)local_2e4.smallend.vect[0] * 8 + (long)local_2b8.begin.x * -8 +
                 (long)local_2b8.p;
        lVar20 = (local_2c8 - vfrac.begin.y) * lVar9 + (lVar14 - vfrac.begin.z) * lVar17 +
                 (long)local_2e4.smallend.vect[0] * 8 + (long)vfrac.begin.x * -8 +
                 CONCAT44(vfrac.p._4_4_,(int)vfrac.p);
        for (; lVar10 = lVar15, lVar13 = local_2c8, lVar18 = lVar20,
            lVar14 <= local_2e4.bigend.vect[2]; lVar14 = lVar14 + 1) {
          for (; lVar13 <= local_2e4.bigend.vect[1]; lVar13 = lVar13 + 1) {
            if (local_2e4.smallend.vect[0] <= local_2e4.bigend.vect[0]) {
              lVar12 = 0;
              do {
                *(double *)(lVar10 + lVar12 * 8) =
                     *(double *)(lVar18 + lVar12 * 8) * *(double *)(lVar10 + lVar12 * 8);
                lVar12 = lVar12 + 1;
              } while ((local_2e4.bigend.vect[0] - local_2e4.smallend.vect[0]) + 1 != (int)lVar12);
            }
            lVar10 = lVar10 + local_2b8.jstride * 8;
            lVar18 = lVar18 + lVar9;
          }
          lVar15 = lVar15 + local_2b8.kstride * 8;
          lVar20 = lVar20 + lVar17;
        }
      }
    }
    amrex::MFIter::operator++(&mfi);
  }
  __cxa_bad_cast();
}

Assistant:

Real
PeleLM::getCellsCount()
{
#ifdef AMREX_USE_EB
   MultiFab MFTemp(grids,dmap,1,0);
   MFTemp.setVal(1.0);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(MFTemp,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& temp = MFTemp.array(mfi);
      auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Factory());
      auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
      auto const& flag    = flagfab.const_array();

      if (flagfab.getType(bx) == FabType::covered) {              // Covered boxes
         amrex::ParallelFor(bx, [temp]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) = 0.0;
         });
      } else if (flagfab.getType(bx) != FabType::regular ) {     // EB containing boxes
         auto vfrac = ebfactory.getVolFrac().const_array(mfi);
         amrex::ParallelFor(bx, [temp,vfrac]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) *= vfrac(i,j,k);
         });
      }
   }

   Real count = amrex::ReduceSum(MFTemp, 0, []
   AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& dat ) noexcept -> Real
   {
      Real r = 0.0;
      AMREX_LOOP_3D(bx,i,j,k,
      {
         r += dat(i,j,k);
      });
      return r;
   });
   ParallelDescriptor::ReduceRealSum(count);

   return count;
#else
   Real count = grids.numPts();
   return count;
#endif
}